

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariableTests.cpp
# Opt level: O0

void __thiscall
triggervariable_reset1_Test::~triggervariable_reset1_Test(triggervariable_reset1_Test *this)

{
  triggervariable_reset1_Test *this_local;
  
  ~triggervariable_reset1_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(triggervariable, reset1)
{
    TriggerVariable trigger(true);

    EXPECT_TRUE(trigger.isActive());
    EXPECT_TRUE(trigger.trigger());

    trigger.reset();

    EXPECT_FALSE(trigger.isActive());
    EXPECT_TRUE(trigger.isTriggered());

    EXPECT_TRUE(trigger.activate());
    EXPECT_FALSE(trigger.isTriggered());
    EXPECT_TRUE(trigger.isActive());
}